

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_portable_decoder.h
# Opt level: O0

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::SetParentAttribute
          (MeshPredictionSchemeTexCoordsPortableDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,PointAttribute *att)

{
  uint8_t uVar1;
  Type TVar2;
  PointAttribute *in_RSI;
  long in_RDI;
  
  if ((in_RSI != (PointAttribute *)0x0) &&
     (TVar2 = GeometryAttribute::attribute_type(&in_RSI->super_GeometryAttribute), TVar2 == POSITION
     )) {
    uVar1 = GeometryAttribute::num_components(&in_RSI->super_GeometryAttribute);
    if (uVar1 != '\x03') {
      return false;
    }
    MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
    ::SetPositionAttribute
              ((MeshPredictionSchemeTexCoordsPortablePredictor<int,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                *)(in_RDI + 0x60),in_RSI);
    return true;
  }
  return false;
}

Assistant:

bool SetParentAttribute(const PointAttribute *att) override {
    if (!att || att->attribute_type() != GeometryAttribute::POSITION) {
      return false;  // Invalid attribute type.
    }
    if (att->num_components() != 3) {
      return false;  // Currently works only for 3 component positions.
    }
    predictor_.SetPositionAttribute(*att);
    return true;
  }